

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O1

void __thiscall mocker::detail::InterferenceGraph::combine(InterferenceGraph *this,Node *v,Node *u)

{
  element_type *peVar1;
  const_iterator cVar2;
  iterator __it;
  iterator iVar3;
  iterator iVar4;
  undefined8 uVar5;
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_00;
  pointer __k;
  Node local_68;
  Node local_58;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_48;
  
  cVar2 = std::
          _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->freeze)._M_h,v);
  this_00 = &(this->highDegree)._M_h;
  if (cVar2.super__Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true>._M_cur !=
      (__node_type *)0x0) {
    this_00 = &(this->freeze)._M_h;
  }
  __it = std::
         _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
         ::find(this_00,v);
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::erase(this_00,(const_iterator)
                  __it.super__Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true>.
                  _M_cur);
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_M_emplace<std::shared_ptr<mocker::nasm::Register>const&>
            ((_Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->coalesced,v);
  iVar3 = std::
          _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->alias)._M_h,v);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  *(element_type **)
   ((long)iVar3.
          super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
          ._M_cur + 0x18) =
       (u->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)iVar3.
                    super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                    ._M_cur + 0x20),
             &(u->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  getCurAdjList(&local_48,this,v);
  if (local_48.
      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __k = local_48.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (__k->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (__k->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
      if (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (u->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (u->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
      if (local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      addEdge(this,&local_58,&local_68);
      if (local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      iVar4 = std::
              _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->curDegree)._M_h,__k);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      *(long *)((long)iVar4.
                      super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_true>
                      ._M_cur + 0x18) =
           *(long *)((long)iVar4.
                           super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_true>
                           ._M_cur + 0x18) + -1;
      __k = __k + 1;
    } while (__k != local_48.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~vector(&local_48);
  peVar1 = (u->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar1->identifier)._M_string_length != 0) {
    if (*(peVar1->identifier)._M_dataplus._M_p == 'v') {
      classifyNode(this,u);
    }
    return;
  }
  uVar5 = std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0);
  if (local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~vector(&local_48);
  _Unwind_Resume(uVar5);
}

Assistant:

void InterferenceGraph::combine(const Node &v, const Node &u) {
  if (isIn(freeze, v))
    freeze.erase(freeze.find(v));
  else
    highDegree.erase(highDegree.find(v));
  coalesced.emplace(v);
  alias.at(v) = u;
  // The associated moves are handle externally

  for (auto &t : getCurAdjList(v)) {
    // Note that we do not remove node v explicitly. Hence, we have to
    // decrement the degree of t manually.
    addEdge(t, u);
    curDegree.at(t)--;

    // Do not use decrementDegree here since it may trigger some unnecessary
    // task if the original degree of t is K
    //    if (!isPrecolored(t))
    //      classifyNode(t);
    //    decrementDegree(t);
  }
  if (!isPrecolored(u))
    classifyNode(u);
}